

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::SSAPropagator::IsPhiArgExecutable(SSAPropagator *this,Instruction *phi,uint32_t i)

{
  bool bVar1;
  DefUseManager *this_00;
  Edge local_50;
  BasicBlock *local_40;
  BasicBlock *in_bb;
  Instruction *in_label_instr;
  BasicBlock *pBStack_28;
  uint32_t in_label_id;
  BasicBlock *phi_bb;
  Instruction *pIStack_18;
  uint32_t i_local;
  Instruction *phi_local;
  SSAPropagator *this_local;
  
  phi_bb._4_4_ = i;
  pIStack_18 = phi;
  phi_local = (Instruction *)this;
  pBStack_28 = IRContext::get_instr_block(this->ctx_,phi);
  in_label_instr._4_4_ = Instruction::GetSingleWordOperand(pIStack_18,phi_bb._4_4_ + 1);
  this_00 = get_def_use_mgr(this);
  in_bb = (BasicBlock *)analysis::DefUseManager::GetDef(this_00,in_label_instr._4_4_);
  local_40 = IRContext::get_instr_block(this->ctx_,(Instruction *)in_bb);
  Edge::Edge(&local_50,local_40,pBStack_28);
  bVar1 = IsEdgeExecutable(this,&local_50);
  return bVar1;
}

Assistant:

bool SSAPropagator::IsPhiArgExecutable(Instruction* phi, uint32_t i) const {
  BasicBlock* phi_bb = ctx_->get_instr_block(phi);

  uint32_t in_label_id = phi->GetSingleWordOperand(i + 1);
  Instruction* in_label_instr = get_def_use_mgr()->GetDef(in_label_id);
  BasicBlock* in_bb = ctx_->get_instr_block(in_label_instr);

  return IsEdgeExecutable(Edge(in_bb, phi_bb));
}